

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

uint8_t * __thiscall
edition_unittest::TestRequiredOneof::_InternalSerialize
          (TestRequiredOneof *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  WireFormatLite *this_00;
  ulong uVar1;
  undefined8 *puVar2;
  uint8_t *puVar3;
  int cached_size;
  MessageLite *value;
  int field_number;
  char *in_R9;
  string_view s;
  string_view field_name;
  
  switch((this->field_0)._impl_._oneof_case_[0]) {
  case 1:
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,*(int32_t *)&this->field_0,target);
    break;
  case 2:
    puVar2 = (undefined8 *)((ulong)(this->field_0)._impl_.foo_.foo_message_ & 0xfffffffffffffffc);
    this_00 = (WireFormatLite *)*puVar2;
    uVar1 = puVar2[1];
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"edition_unittest.TestRequiredOneof.foo_string";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (this_00,(char *)(uVar1 & 0xffffffff),1,0x2d,field_name);
    s._M_str = (char *)this_00;
    s._M_len = uVar1;
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,2,s,target);
    break;
  case 3:
    value = *(MessageLite **)&this->field_0;
    cached_size = *(int *)((long)&value[1]._vptr_MessageLite + 4);
    field_number = 3;
    goto LAB_00c3a97f;
  case 4:
    value = *(MessageLite **)&this->field_0;
    cached_size = *(int *)((long)&value[1]._vptr_MessageLite + 4);
    field_number = 4;
LAB_00c3a97f:
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (field_number,value,cached_size,target,stream);
  }
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    puVar3 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar3;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestRequiredOneof::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestRequiredOneof& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestRequiredOneof)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  switch (this_.foo_case()) {
    case kFooInt: {
      target =
          ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
              stream, this_._internal_foo_int(), target);
      break;
    }
    case kFooString: {
      const ::absl::string_view _s = this_._internal_foo_string();
      ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestRequiredOneof.foo_string");
      target = stream->WriteStringMaybeAliased(2, _s, target);
      break;
    }
    case kFooMessage: {
      target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
          3, *this_._impl_.foo_.foo_message_, this_._impl_.foo_.foo_message_->GetCachedSize(), target,
          stream);
      break;
    }
    case kFooLazyMessage: {
      target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
          4, *this_._impl_.foo_.foo_lazy_message_, this_._impl_.foo_.foo_lazy_message_->GetCachedSize(), target,
          stream);
      break;
    }
    default:
      break;
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestRequiredOneof)
  return target;
}